

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_cache_lcp_2way_parallel<true,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  uchar **strings_input_00;
  uchar **strings_output_00;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  unsigned_short *cache_output_00;
  size_t __n;
  uchar *puVar1;
  uint16_t uVar2;
  MergeResult MVar3;
  MergeResult MVar4;
  ostream *poVar5;
  lcp_t depth;
  lcp_t lVar6;
  size_t depth_00;
  unsigned_short *cache_input_00;
  size_t n_00;
  ulong uVar7;
  uint uVar8;
  
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"mergesort_cache_lcp_2way_parallel");
  poVar5 = std::operator<<(poVar5,"(): n=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,'\n');
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,depth_00);
    puVar1 = *strings_input;
    depth = lcp(puVar1,strings_input[1]);
    *lcp_input = depth;
    uVar2 = get_char<unsigned_short>(puVar1,0);
    *cache_input = uVar2;
    for (uVar8 = 2; uVar7 = (ulong)(uVar8 - 1), uVar7 < n - 1; uVar8 = uVar8 + 1) {
      puVar1 = strings_input[uVar7];
      lVar6 = lcp(puVar1,strings_input[uVar8]);
      lcp_input[uVar7] = lVar6;
      uVar2 = get_char<unsigned_short>(puVar1,depth);
      cache_input[uVar7] = uVar2;
      depth = lVar6;
    }
    uVar2 = get_char<unsigned_short>(strings_input[n - 1],lcp_input[n - 2]);
    cache_input[n - 1] = uVar2;
    check_input<unsigned_short>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  uVar7 = n >> 1;
  MVar3 = mergesort_cache_lcp_2way_parallel<true,unsigned_short>
                    (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                     uVar7);
  if (MVar3 == SortedInPlace) {
    check_input<unsigned_short>(strings_input,lcp_input,cache_input,uVar7);
  }
  else {
    check_input<unsigned_short>(strings_output,lcp_output,cache_output,uVar7);
  }
  strings_input_00 = strings_input + uVar7;
  strings_output_00 = strings_output + uVar7;
  lcp_input_00 = lcp_input + uVar7;
  lcp_output_00 = lcp_output + uVar7;
  cache_input_00 = cache_input + uVar7;
  cache_output_00 = cache_output + uVar7;
  n_00 = n - uVar7;
  MVar4 = mergesort_cache_lcp_2way_parallel<true,unsigned_short>
                    (strings_input_00,strings_output_00,lcp_input_00,lcp_output_00,cache_input_00,
                     cache_output_00,n_00);
  if (MVar3 == SortedInPlace) {
    check_input<unsigned_short>(strings_input_00,lcp_input_00,cache_input_00,n_00);
    if (MVar4 == SortedInPlace) {
      merge_cache_lcp_2way<true,unsigned_short>
                (strings_input,lcp_input,cache_input,uVar7,strings_input_00,lcp_input_00,
                 cache_input_00,n_00,strings_output,lcp_output,cache_output);
      return SortedInTemp;
    }
  }
  else {
    check_input<unsigned_short>(strings_output_00,lcp_output_00,cache_output_00,n_00);
    if (MVar3 == MVar4) goto LAB_0021f19c;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"Warning: extra copying due to m0 != m1. n=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  __n = uVar7 * 8;
  if (MVar3 == SortedInPlace) {
    memmove(strings_output,strings_input,__n);
    memcpy(cache_output,cache_input,n & 0xfffffffffffffffe);
    memcpy(lcp_output,lcp_input,__n);
    MVar3 = SortedInTemp;
  }
  else {
    memmove(strings_input,strings_output,__n);
    memcpy(cache_input,cache_output,n & 0xfffffffffffffffe);
    memcpy(lcp_input,lcp_output,__n);
    MVar4 = SortedInTemp;
  }
  if (MVar3 != MVar4) {
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x5e2,
                  "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
LAB_0021f19c:
  merge_cache_lcp_2way<true,unsigned_short>
            (strings_output,lcp_output,cache_output,uVar7,strings_output_00,lcp_output_00,
             cache_output_00,n_00,strings_input,lcp_input,cache_input);
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}